

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void expr_stmt(Vm *vm)

{
  Vm *vm_local;
  
  expr(vm);
  if (((vm->interactive & 1U) == 0) || (((vm->compiler).print_expr & 1U) == 0)) {
    emit_no_arg(vm,OP_POP);
  }
  else {
    (vm->compiler).print_expr = false;
    emit_no_arg(vm,OP_PRINT);
  }
  consume_optional(vm,TOKEN_SEMICOLON);
  return;
}

Assistant:

static void expr_stmt(Vm *vm) {
    expr(vm);

    if (vm->interactive && vm->compiler.print_expr) {
        vm->compiler.print_expr = false;
        emit_no_arg(vm, OP_PRINT);
    } else {
        emit_no_arg(vm, OP_POP);
    }

    consume_optional(vm, TOKEN_SEMICOLON);
}